

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<int>_conflict * __thiscall
kj::ArrayBuilder<int>::operator=(ArrayBuilder<int> *this,ArrayBuilder<int>_conflict *other)

{
  ArrayBuilder<int>_conflict *other_local;
  ArrayBuilder<int>_conflict *this_local;
  
  dispose(this);
  this->ptr = (int *)other->ptr;
  this->pos = other->pos;
  this->endPtr = (int *)other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (char (*) [7])0x0;
  other->pos = (RemoveConst<int> *)0x0;
  other->endPtr = (char (*) [7])0x0;
  return (ArrayBuilder<int>_conflict *)this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }